

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

char * searchpath(lua_State *L,char *name,char *path,char *sep,char *dirsep)

{
  char *pcVar1;
  char *pcVar2;
  FILE *__stream;
  size_t len;
  luaL_Buffer msg;
  luaL_Buffer local_2050;
  
  luaL_buffinit(L,&local_2050);
  if (*sep != '\0') {
    name = luaL_gsub(L,name,sep,dirsep);
  }
  while( true ) {
    for (; *path == ';'; path = path + 1) {
    }
    if (*path == '\0') break;
    pcVar1 = strchr(path,0x3b);
    if (pcVar1 == (char *)0x0) {
      len = strlen(path);
      pcVar1 = path + len;
    }
    else {
      len = (long)pcVar1 - (long)path;
    }
    lua_pushlstring(L,path,len);
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
    pcVar2 = luaL_gsub(L,pcVar2,"?",name);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
    __stream = fopen64(pcVar2,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      return pcVar2;
    }
    lua_pushfstring(L,"\n\tno file \'%s\'",pcVar2);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
    luaL_addvalue(&local_2050);
    path = pcVar1;
  }
  luaL_pushresult(&local_2050);
  return (char *)0x0;
}

Assistant:

static const char *searchpath(lua_State *L, const char *name,
                              const char *path,
                              const char *sep,
                              const char *dirsep) {
    luaL_Buffer msg;  /* to build error message */
    luaL_buffinit(L, &msg);
    if (*sep != '\0')  /* non-empty separator? */
        name = luaL_gsub(L, name, sep, dirsep);  /* replace it by 'dirsep' */
    while ((path = pushnexttemplate(L, path)) != NULL) {
        const char *filename = luaL_gsub(L, lua_tostring(L, -1),
                                         LUA_PATH_MARK, name);
        lua_remove(L, -2);  /* remove path template */
        if (readable(filename))  /* does file exist and is readable? */
            return filename;  /* return that file name */
        lua_pushfstring(L, "\n\tno file '%s'", filename);
        lua_remove(L, -2);  /* remove file name */
        luaL_addvalue(&msg);  /* concatenate error msg. entry */
    }
    luaL_pushresult(&msg);  /* create error message */
    return NULL;  /* not found */
}